

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O2

void __thiscall
duckdb::BlockHandle::ConvertToPersistent
          (BlockHandle *this,BlockLock *l,BlockHandle *new_block,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *new_buffer)

{
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var1;
  
  LOCK();
  (new_block->state)._M_i = BLOCK_LOADED;
  UNLOCK();
  ::std::__uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>::operator=
            ((__uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_> *)
             &new_block->buffer,
             (__uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_> *)
             new_buffer);
  LOCK();
  (new_block->memory_usage).super___atomic_base<unsigned_long>._M_i =
       (this->memory_usage).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  (new_block->memory_charge).tag = (this->memory_charge).tag;
  (new_block->memory_charge).size = (this->memory_charge).size;
  (this->memory_charge).size = 0;
  _Var1._M_head_impl =
       (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
  if (_Var1._M_head_impl != (FileBuffer *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_FileBuffer + 8))();
  }
  LOCK();
  (this->state)._M_i = BLOCK_UNLOADED;
  UNLOCK();
  LOCK();
  (this->memory_usage).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

void BlockHandle::ConvertToPersistent(BlockLock &l, BlockHandle &new_block, unique_ptr<FileBuffer> new_buffer) {
	VerifyMutex(l);

	// move the data from the old block into data for the new block
	new_block.state = BlockState::BLOCK_LOADED;
	new_block.buffer = std::move(new_buffer);
	new_block.memory_usage = memory_usage.load();
	new_block.memory_charge = std::move(memory_charge);

	// clear out the buffer data from this block
	buffer.reset();
	state = BlockState::BLOCK_UNLOADED;
	memory_usage = 0;
}